

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Binasc.cpp
# Opt level: O2

int __thiscall
smf::Binasc::readMidiEvent(Binasc *this,ostream *out,istream *infile,int *trackbytes,int *command)

{
  uchar uVar1;
  uchar uVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  ostream *poVar6;
  Binasc *pBVar7;
  uint uVar8;
  int key;
  int key_00;
  uint uVar9;
  char *pcVar10;
  bool bVar11;
  uchar ch;
  Binasc *local_230;
  int local_224;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220;
  ostream *local_200;
  string local_1f8;
  string comment;
  stringstream output;
  long local_1a8 [3];
  uint auStack_190 [88];
  
  local_230 = this;
  local_200 = out;
  iVar3 = getVLV(this,infile,trackbytes);
  std::__cxx11::stringstream::stringstream((stringstream *)&output);
  poVar6 = std::operator<<((ostream *)local_1a8,"v");
  *(uint *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x18) =
       *(uint *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x18) & 0xffffffb5 | 2;
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar3);
  std::operator<<(poVar6,"\t");
  comment._M_dataplus._M_p = (pointer)&comment.field_2;
  comment._M_string_length = 0;
  comment.field_2._M_local_buf[0] = '\0';
  std::istream::read((char *)infile,(long)&ch);
  *trackbytes = *trackbytes + 1;
  if ((char)ch < '\0') {
    *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) =
         *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) & 0xffffffb5 | 8;
    std::ostream::operator<<(local_1a8,(uint)ch);
    *command = (uint)ch;
    std::istream::read((char *)infile,(long)&ch);
    *trackbytes = *trackbytes + 1;
  }
  else {
    std::operator<<((ostream *)local_1a8,"   ");
  }
  uVar1 = ch;
  uVar5 = *command;
  uVar8 = (uVar5 & 0xf0) - 0x80 >> 4;
  local_224 = 1;
  if (7 < uVar8) goto LAB_0011d1d8;
  uVar9 = (uint)(char)ch;
  switch(uVar8) {
  case 0:
    poVar6 = std::operator<<((ostream *)local_1a8," \'");
    *(uint *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x18) =
         *(uint *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x18) & 0xffffffb5 | 2;
    std::ostream::operator<<(poVar6,uVar9);
    std::istream::read((char *)infile,(long)&ch);
    *trackbytes = *trackbytes + 1;
    poVar6 = std::operator<<((ostream *)local_1a8," \'");
    *(uint *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x18) =
         *(uint *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x18) & 0xffffffb5 | 2;
    std::ostream::operator<<(poVar6,(int)(char)ch);
    if (local_230->m_commentsQ != 0) {
      keyToPitchName_abi_cxx11_(&local_1f8,(Binasc *)(ulong)uVar9,key);
      std::operator+(&local_220,"note-off ",&local_1f8);
      std::__cxx11::string::append((string *)&comment);
LAB_0011d1c4:
      std::__cxx11::string::~string((string *)&local_220);
      std::__cxx11::string::~string((string *)&local_1f8);
    }
    break;
  case 1:
    poVar6 = std::operator<<((ostream *)local_1a8," \'");
    *(uint *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x18) =
         *(uint *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x18) & 0xffffffb5 | 2;
    std::ostream::operator<<(poVar6,uVar9);
    std::istream::read((char *)infile,(long)&ch);
    *trackbytes = *trackbytes + 1;
    poVar6 = std::operator<<((ostream *)local_1a8," \'");
    *(uint *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x18) =
         *(uint *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x18) & 0xffffffb5 | 2;
    std::ostream::operator<<(poVar6,(int)(char)ch);
    if (local_230->m_commentsQ != 0) {
      if (ch == '\0') {
        keyToPitchName_abi_cxx11_(&local_1f8,(Binasc *)(ulong)uVar9,key_00);
        std::operator+(&local_220,"note-off ",&local_1f8);
        std::__cxx11::string::append((string *)&comment);
      }
      else {
        keyToPitchName_abi_cxx11_(&local_1f8,(Binasc *)(ulong)uVar9,key_00);
        std::operator+(&local_220,"note-on ",&local_1f8);
        std::__cxx11::string::append((string *)&comment);
      }
      goto LAB_0011d1c4;
    }
    break;
  case 2:
    poVar6 = std::operator<<((ostream *)local_1a8," \'");
    *(uint *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x18) =
         *(uint *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x18) & 0xffffffb5 | 2;
    std::ostream::operator<<(poVar6,uVar9);
    std::istream::read((char *)infile,(long)&ch);
    *trackbytes = *trackbytes + 1;
    poVar6 = std::operator<<((ostream *)local_1a8," \'");
    *(uint *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x18) =
         *(uint *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x18) & 0xffffffb5 | 2;
    std::ostream::operator<<(poVar6,(int)(char)ch);
    iVar3 = local_230->m_commentsQ;
    goto joined_r0x0011cdd8;
  case 3:
    poVar6 = std::operator<<((ostream *)local_1a8," \'");
    *(uint *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x18) =
         *(uint *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x18) & 0xffffffb5 | 2;
    std::ostream::operator<<(poVar6,uVar9);
    std::istream::read((char *)infile,(long)&ch);
    *trackbytes = *trackbytes + 1;
    poVar6 = std::operator<<((ostream *)local_1a8," \'");
    *(uint *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x18) =
         *(uint *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x18) & 0xffffffb5 | 2;
    std::ostream::operator<<(poVar6,(int)(char)ch);
    iVar3 = local_230->m_commentsQ;
joined_r0x0011cdd8:
    if (iVar3 != 0) {
LAB_0011d07e:
      std::__cxx11::string::append((char *)&comment);
    }
    break;
  case 4:
    poVar6 = std::operator<<((ostream *)local_1a8," \'");
    *(uint *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x18) =
         *(uint *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x18) & 0xffffffb5 | 2;
    std::ostream::operator<<(poVar6,uVar9);
    if (local_230->m_commentsQ == 0) break;
    std::operator<<((ostream *)local_1a8,"\t");
    goto LAB_0011d07e;
  case 5:
    poVar6 = std::operator<<((ostream *)local_1a8," \'");
    *(uint *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x18) =
         *(uint *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x18) & 0xffffffb5 | 2;
    std::ostream::operator<<(poVar6,uVar9);
    iVar3 = local_230->m_commentsQ;
    goto joined_r0x0011d071;
  case 6:
    poVar6 = std::operator<<((ostream *)local_1a8," \'");
    *(uint *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x18) =
         *(uint *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x18) & 0xffffffb5 | 2;
    std::ostream::operator<<(poVar6,uVar9);
    std::istream::read((char *)infile,(long)&ch);
    *trackbytes = *trackbytes + 1;
    poVar6 = std::operator<<((ostream *)local_1a8," \'");
    *(uint *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x18) =
         *(uint *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x18) & 0xffffffb5 | 2;
    std::ostream::operator<<(poVar6,(int)(char)ch);
    iVar3 = local_230->m_commentsQ;
joined_r0x0011d071:
    if (iVar3 == 0) break;
    goto LAB_0011d07e;
  case 7:
    if (uVar5 == 0xff) {
      pBVar7 = (Binasc *)std::operator<<((ostream *)local_1a8," ");
      *(uint *)((long)&pBVar7[1].m_commentsQ + *(long *)(*(long *)pBVar7 + -0x18)) =
           *(uint *)((long)&pBVar7[1].m_commentsQ + *(long *)(*(long *)pBVar7 + -0x18)) & 0xffffffb5
           | 8;
      std::ostream::operator<<(pBVar7,(uint)uVar1);
      iVar3 = getVLV(pBVar7,infile,trackbytes);
      poVar6 = std::operator<<((ostream *)local_1a8," v");
      *(uint *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x18) =
           *(uint *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x18) & 0xffffffb5 | 2;
      std::ostream::operator<<(poVar6,iVar3);
      uVar5 = (uint)uVar1;
      if (uVar5 - 1 < 9) {
        std::operator<<((ostream *)local_1a8," \"");
        iVar4 = 0;
        if (0 < iVar3) {
          iVar4 = iVar3;
        }
        while (bVar11 = iVar4 != 0, iVar4 = iVar4 + -1, bVar11) {
          std::istream::read((char *)infile,(long)&ch);
          *trackbytes = *trackbytes + 1;
          std::operator<<((ostream *)local_1a8,ch);
        }
        std::operator<<((ostream *)local_1a8,"\"");
LAB_0011d26d:
        switch(uVar1) {
        case '\0':
switchD_0011d287_caseD_0:
          break;
        case '\x01':
          break;
        case '\x02':
          break;
        case '\x03':
          break;
        case '\x04':
          break;
        case '\x05':
          break;
        case '\x06':
          break;
        case '\a':
          break;
        case '\b':
          break;
        case '\t':
          break;
        default:
          switch(uVar1) {
          case 'Q':
            goto switchD_0011d3c5_caseD_51;
          case 'R':
          case 'S':
          case 'U':
          case 'V':
          case 'W':
switchD_0011d3c5_caseD_52:
            break;
          case 'T':
            goto switchD_0011d3c5_caseD_54;
          case 'X':
            goto switchD_0011d3c5_caseD_58;
          case 'Y':
            goto switchD_0011d3c5_caseD_59;
          default:
            if ((uVar1 != ' ') && (uVar1 != '!')) {
              if (uVar1 == '/') {
                local_224 = 0;
                std::__cxx11::string::append((char *)&comment);
                goto LAB_0011d1d8;
              }
              if (uVar1 != '\x7f') goto switchD_0011d3c5_caseD_52;
            }
          }
        }
      }
      else {
        switch(uVar5) {
        case 0x51:
          std::istream::read((char *)infile,(long)&ch);
          uVar1 = ch;
          *trackbytes = *trackbytes + 1;
          std::istream::read((char *)infile,(long)&ch);
          uVar2 = ch;
          *trackbytes = *trackbytes + 1;
          std::istream::read((char *)infile,(long)&ch);
          *trackbytes = *trackbytes + 1;
          std::operator<<((ostream *)local_1a8," t");
          std::ostream::_M_insert<double>
                    ((1000000.0 / (double)((uint)uVar2 << 8 | (uint)uVar1 << 0x10 | (uint)ch)) *
                     60.0);
switchD_0011d3c5_caseD_51:
          break;
        case 0x52:
        case 0x53:
        case 0x55:
        case 0x56:
        case 0x57:
switchD_0011d2af_caseD_52:
          iVar4 = 0;
          if (0 < iVar3) {
            iVar4 = iVar3;
          }
          while (bVar11 = iVar4 != 0, iVar4 = iVar4 + -1, bVar11) {
            std::istream::read((char *)infile,(long)&ch);
            *trackbytes = *trackbytes + 1;
            std::operator<<((ostream *)local_1a8," ");
            if (ch < 0x10) {
              std::operator<<((ostream *)local_1a8,"0");
            }
            *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) =
                 *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) & 0xffffffb5 | 8;
            std::ostream::operator<<(local_1a8,(uint)ch);
          }
          goto LAB_0011d26d;
        case 0x54:
          std::istream::read((char *)infile,(long)&ch);
          *trackbytes = *trackbytes + 1;
          poVar6 = std::operator<<((ostream *)local_1a8," \'");
          std::ostream::operator<<(poVar6,(uint)ch);
          std::istream::read((char *)infile,(long)&ch);
          *trackbytes = *trackbytes + 1;
          poVar6 = std::operator<<((ostream *)local_1a8," \'");
          std::ostream::operator<<(poVar6,(uint)ch);
          std::istream::read((char *)infile,(long)&ch);
          *trackbytes = *trackbytes + 1;
          poVar6 = std::operator<<((ostream *)local_1a8," \'");
          std::ostream::operator<<(poVar6,(uint)ch);
          std::istream::read((char *)infile,(long)&ch);
          *trackbytes = *trackbytes + 1;
          poVar6 = std::operator<<((ostream *)local_1a8," \'");
          std::ostream::operator<<(poVar6,(uint)ch);
          std::istream::read((char *)infile,(long)&ch);
          *trackbytes = *trackbytes + 1;
          poVar6 = std::operator<<((ostream *)local_1a8," \'");
          std::ostream::operator<<(poVar6,(uint)ch);
switchD_0011d3c5_caseD_54:
          break;
        case 0x58:
          std::istream::read((char *)infile,(long)&ch);
          *trackbytes = *trackbytes + 1;
          poVar6 = std::operator<<((ostream *)local_1a8," \'");
          std::ostream::operator<<(poVar6,(uint)ch);
          std::istream::read((char *)infile,(long)&ch);
          *trackbytes = *trackbytes + 1;
          poVar6 = std::operator<<((ostream *)local_1a8," \'");
          std::ostream::operator<<(poVar6,(uint)ch);
          std::istream::read((char *)infile,(long)&ch);
          *trackbytes = *trackbytes + 1;
          poVar6 = std::operator<<((ostream *)local_1a8," \'");
          std::ostream::operator<<(poVar6,(uint)ch);
          std::istream::read((char *)infile,(long)&ch);
          *trackbytes = *trackbytes + 1;
          poVar6 = std::operator<<((ostream *)local_1a8," \'");
          std::ostream::operator<<(poVar6,(uint)ch);
switchD_0011d3c5_caseD_58:
          break;
        case 0x59:
          std::istream::read((char *)infile,(long)&ch);
          *trackbytes = *trackbytes + 1;
          poVar6 = std::operator<<((ostream *)local_1a8," \'");
          std::ostream::operator<<(poVar6,(uint)ch);
          std::istream::read((char *)infile,(long)&ch);
          *trackbytes = *trackbytes + 1;
          poVar6 = std::operator<<((ostream *)local_1a8," \'");
          std::ostream::operator<<(poVar6,(uint)ch);
switchD_0011d3c5_caseD_59:
          break;
        default:
          if (uVar5 - 0x20 < 2) {
            std::istream::read((char *)infile,(long)&ch);
            *trackbytes = *trackbytes + 1;
            poVar6 = std::operator<<((ostream *)local_1a8," \'");
            std::ostream::operator<<(poVar6,(uint)ch);
            goto LAB_0011d26d;
          }
          if (uVar1 != '\0') goto switchD_0011d2af_caseD_52;
          std::istream::read((char *)infile,(long)&ch);
          uVar1 = ch;
          *trackbytes = *trackbytes + 1;
          std::istream::read((char *)infile,(long)&ch);
          *trackbytes = *trackbytes + 1;
          poVar6 = std::operator<<((ostream *)local_1a8," 2\'");
          std::ostream::operator<<(poVar6,(uint)CONCAT11(uVar1,ch));
          goto switchD_0011d287_caseD_0;
        }
      }
      std::__cxx11::string::append((char *)&comment);
    }
    else {
      if (uVar5 == 0xfe) {
        poVar6 = std::operator<<((ostream *)&std::cerr,"Error command not yet handled");
        local_224 = 0;
        std::endl<char,std::char_traits<char>>(poVar6);
        goto LAB_0011d22c;
      }
      if (uVar5 == 0xf7) {
        pBVar7 = (Binasc *)infile;
        std::istream::putback((char)infile);
        *trackbytes = *trackbytes + -1;
        iVar4 = getVLV(pBVar7,infile,trackbytes);
        poVar6 = std::operator<<((ostream *)local_1a8," v");
        *(uint *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x18) =
             *(uint *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x18) & 0xffffffb5 | 2;
        std::ostream::operator<<(poVar6,iVar4);
        iVar3 = 0;
        if (0 < iVar4) {
          iVar3 = iVar4;
        }
        while (bVar11 = iVar3 != 0, iVar3 = iVar3 + -1, bVar11) {
          std::istream::read((char *)infile,(long)&ch);
          *trackbytes = *trackbytes + 1;
          pcVar10 = " 0";
          if (0xf < ch) {
            pcVar10 = " ";
          }
          poVar6 = std::operator<<((ostream *)local_1a8,pcVar10);
          *(uint *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x18) =
               *(uint *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x18) & 0xffffffb5 | 8;
          std::ostream::operator<<(poVar6,(uint)ch);
        }
      }
    }
  }
LAB_0011d1d8:
  std::__cxx11::stringbuf::str();
  std::operator<<(local_200,(string *)&local_220);
  std::__cxx11::string::~string((string *)&local_220);
  if (local_230->m_commentsQ != 0) {
    poVar6 = std::operator<<(local_200,"\t; ");
    std::operator<<(poVar6,(string *)&comment);
  }
LAB_0011d22c:
  std::__cxx11::string::~string((string *)&comment);
  std::__cxx11::stringstream::~stringstream((stringstream *)&output);
  return local_224;
}

Assistant:

int Binasc::readMidiEvent(std::ostream& out, std::istream& infile,
		int& trackbytes, int& command) {

	// Read and print Variable Length Value for delta ticks
	int vlv = getVLV(infile, trackbytes);

	std::stringstream output;

	output << "v" << std::dec << vlv << "\t";

	std::string comment;

	int status = 1;
	uchar ch;
	char byte1, byte2;
	infile.read((char*)&ch, 1);
	trackbytes++;
	if (ch < 0x80) {
		// running status: command byte is previous one in data stream
		output << "   ";
	} else {
		// midi command byte
		output << std::hex << (int)ch;
		command = ch;
		infile.read((char*)&ch, 1);
		trackbytes++;
	}
	byte1 = ch;
	switch (command & 0xf0) {
		case 0x80:    // note-off: 2 bytes
			output << " '" << std::dec << (int)byte1;
			infile.read((char*)&ch, 1);
			trackbytes++;
			byte2 = ch;
			output << " '" << std::dec << (int)byte2;
			if (m_commentsQ) {
				comment += "note-off " + keyToPitchName(byte1);
			}
			break;
		case 0x90:    // note-on: 2 bytes
			output << " '" << std::dec << (int)byte1;
			infile.read((char*)&ch, 1);
			trackbytes++;
			byte2 = ch;
			output << " '" << std::dec << (int)byte2;
			if (m_commentsQ) {
				if (byte2 == 0) {
					comment += "note-off " + keyToPitchName(byte1);
				} else {
					comment += "note-on " + keyToPitchName(byte1);
				}
			}
			break;
		case 0xA0:    // aftertouch: 2 bytes
			output << " '" << std::dec << (int)byte1;
			infile.read((char*)&ch, 1);
			trackbytes++;
			byte2 = ch;
			output << " '" << std::dec << (int)byte2;
			if (m_commentsQ) {
				comment += "after-touch";
			}
			break;
		case 0xB0:    // continuous controller: 2 bytes
			output << " '" << std::dec << (int)byte1;
			infile.read((char*)&ch, 1);
			trackbytes++;
			byte2 = ch;
			output << " '" << std::dec << (int)byte2;
			if (m_commentsQ) {
				comment += "controller";
			}
			break;
		case 0xE0:    // pitch-bend: 2 bytes
			output << " '" << std::dec << (int)byte1;
			infile.read((char*)&ch, 1);
			trackbytes++;
			byte2 = ch;
			output << " '" << std::dec << (int)byte2;
			if (m_commentsQ) {
				comment += "pitch-bend";
			}
			break;
		case 0xC0:    // patch change: 1 bytes
			output << " '" << std::dec << (int)byte1;
			if (m_commentsQ) {
				output << "\t";
				comment += "patch-change";
			}
			break;
		case 0xD0:    // channel pressure: 1 bytes
			output << " '" << std::dec << (int)byte1;
			if (m_commentsQ) {
				comment += "channel pressure";
			}
			break;
		case 0xF0:    // various system bytes: variable bytes
			switch (command) {
				case 0xf0:
					break;
				case 0xf7:
					// Read the first byte which is either 0xf0 or 0xf7.
					// Then a VLV byte count for the number of bytes
					// that remain in the message will follow.
					// Then read that number of bytes.
					{
					infile.putback(byte1);
					trackbytes--;
					int length = getVLV(infile, trackbytes);
					output << " v" << std::dec << length;
					for (int i=0; i<length; i++) {
						infile.read((char*)&ch, 1);
						trackbytes++;
						if (ch < 0x10) {
						   output << " 0" << std::hex << (int)ch;
						} else {
						   output << " " << std::hex << (int)ch;
						}
					}
					}
					break;
				case 0xf1:
					break;
				case 0xf2:
					break;
				case 0xf3:
					break;
				case 0xf4:
					break;
				case 0xf5:
					break;
				case 0xf6:
					break;
				case 0xf8:
					break;
				case 0xf9:
					break;
				case 0xfa:
					break;
				case 0xfb:
					break;
				case 0xfc:
					break;
				case 0xfd:
					break;
				case 0xfe:
					std::cerr << "Error command not yet handled" << std::endl;
					return 0;
					break;
				case 0xff:  // meta message
					{
					int metatype = ch;
					output << " " << std::hex << metatype;
					int length = getVLV(infile, trackbytes);
					output << " v" << std::dec << length;
					switch (metatype) {

						case 0x00:  // sequence number
						   // display two-byte big-endian decimal value.
						   {
						   infile.read((char*)&ch, 1);
						   trackbytes++;
						   int number = ch;
						   infile.read((char*)&ch, 1);
						   trackbytes++;
						   number = (number << 8) | ch;
						   output << " 2'" << number;
						   }
						   break;

						case 0x20: // MIDI channel prefix
						case 0x21: // MIDI port
						   // display single-byte decimal number
						   infile.read((char*)&ch, 1);
						   trackbytes++;
						   output << " '" << (int)ch;
						   break;

						case 0x51: // Tempo
						    // display tempo as "t" word.
						    {
						    int number = 0;
						    infile.read((char*)&ch, 1);
						    trackbytes++;
						    number = (number << 8) | ch;
						    infile.read((char*)&ch, 1);
						    trackbytes++;
						    number = (number << 8) | ch;
						    infile.read((char*)&ch, 1);
						    trackbytes++;
						    number = (number << 8) | ch;
						    double tempo = 1000000.0 / number * 60.0;
						    output << " t" << tempo;
						    }
						    break;

						case 0x54: // SMPTE offset
						    infile.read((char*)&ch, 1);
						    trackbytes++;
						    output << " '" << (int)ch;  // hour
						    infile.read((char*)&ch, 1);
						    trackbytes++;
						    output << " '" << (int)ch;  // minutes
						    infile.read((char*)&ch, 1);
						    trackbytes++;
						    output << " '" << (int)ch;  // seconds
						    infile.read((char*)&ch, 1);
						    trackbytes++;
						    output << " '" << (int)ch;  // frames
						    infile.read((char*)&ch, 1);
						    trackbytes++;
						    output << " '" << (int)ch;  // subframes
						    break;

						case 0x58: // time signature
						    infile.read((char*)&ch, 1);
						    trackbytes++;
						    output << " '" << (int)ch;  // numerator
						    infile.read((char*)&ch, 1);
						    trackbytes++;
						    output << " '" << (int)ch;  // denominator power
						    infile.read((char*)&ch, 1);
						    trackbytes++;
						    output << " '" << (int)ch;  // clocks per beat
						    infile.read((char*)&ch, 1);
						    trackbytes++;
						    output << " '" << (int)ch;  // 32nd notes per beat
						    break;

						case 0x59: // key signature
						    infile.read((char*)&ch, 1);
						    trackbytes++;
						    output << " '" << (int)ch;  // accidentals
						    infile.read((char*)&ch, 1);
						    trackbytes++;
						    output << " '" << (int)ch;  // mode
						    break;

						case 0x01: // text
						case 0x02: // copyright
						case 0x03: // track name
						case 0x04: // instrument name
						case 0x05: // lyric
						case 0x06: // marker
						case 0x07: // cue point
						case 0x08: // program name
						case 0x09: // device name
						   output << " \"";
						   for (int i=0; i<length; i++) {
						      infile.read((char*)&ch, 1);
						      trackbytes++;
						      output << (char)ch;
						   }
						   output << "\"";
						   break;
						default:
						   for (int i=0; i<length; i++) {
						      infile.read((char*)&ch, 1);
						      trackbytes++;
						      output << " ";
						      if (ch < 0x10) {
						         output << "0";
						      }
						      output << std::hex << (int)ch;
						   }
					}
					switch (metatype) {
						case 0x00: comment += "sequence number";     break;
						case 0x01: comment += "text";                break;
						case 0x02: comment += "copyright notice";    break;
						case 0x03: comment += "track name";          break;
						case 0x04: comment += "instrument name";     break;
						case 0x05: comment += "lyric";               break;
						case 0x06: comment += "marker";              break;
						case 0x07: comment += "cue point";           break;
						case 0x08: comment += "program name";        break;
						case 0x09: comment += "device name";         break;
						case 0x20: comment += "MIDI channel prefix"; break;
						case 0x21: comment += "MIDI port";           break;
						case 0x51: comment += "tempo";               break;
						case 0x54: comment += "SMPTE offset";        break;
						case 0x58: comment += "time signature";      break;
						case 0x59: comment += "key signature";       break;
						case 0x7f: comment += "system exclusive";    break;
						case 0x2f:
						   status = 0;
						   comment += "end-of-track";
						   break;
						default:
						   comment += "meta-message";
					}
					}
					break;

			}
			break;
	}

	out << output.str();
	if (m_commentsQ) {
		out << "\t; " << comment;
	}

	return status;
}